

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O3

bool __thiscall inja::Parser::parse_expression_not(Parser *this,Template *tmpl)

{
  Token *pTVar1;
  ulong uVar2;
  const_pointer pcVar3;
  undefined4 uVar4;
  bool bVar5;
  int iVar6;
  size_t __n;
  Token local_38;
  
  if (((this->m_tok).kind == Id) && (uVar2 = (this->m_tok).text.size_, uVar2 != 0)) {
    __n = 3;
    if (uVar2 < 3) {
      __n = uVar2;
    }
    iVar6 = bcmp((this->m_tok).text.data_,"not",__n);
    if ((uVar2 == 3) && (iVar6 == 0)) {
      pTVar1 = &this->m_tok;
      if (this->m_have_peek_tok == true) {
        (this->m_tok).text.size_ = (this->m_peek_tok).text.size_;
        uVar4 = *(undefined4 *)&(this->m_peek_tok).field_0x4;
        pcVar3 = (this->m_peek_tok).text.data_;
        pTVar1->kind = (this->m_peek_tok).kind;
        *(undefined4 *)&pTVar1->field_0x4 = uVar4;
        (this->m_tok).text.data_ = pcVar3;
        this->m_have_peek_tok = false;
      }
      else {
        Lexer::scan(&local_38,&this->m_lexer);
        (this->m_tok).text.size_ = local_38.text.size_;
        pTVar1->kind = local_38.kind;
        *(undefined4 *)&pTVar1->field_0x4 = local_38._4_4_;
        (this->m_tok).text.data_ = local_38.text.data_;
      }
      bVar5 = parse_expression_not(this,tmpl);
      if (bVar5) {
        append_function(this,tmpl,Not,1);
      }
      return bVar5;
    }
  }
  bVar5 = parse_expression_comparison(this,tmpl);
  return bVar5;
}

Assistant:

bool parse_expression_not(Template& tmpl) {
		if (m_tok.kind == Token::Kind::Id && m_tok.text == "not") {
			get_next_token();
			if (!parse_expression_not(tmpl)) return false;
			append_function(tmpl, Bytecode::Op::Not, 1);
			return true;
		} else {
			return parse_expression_comparison(tmpl);
		}
	}